

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_types.cpp
# Opt level: O3

string * ConnectionTypeAsString_abi_cxx11_(string *__return_storage_ptr__,ConnectionType conn_type)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(conn_type) {
  case INBOUND:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_009311cd:
      __stack_chk_fail();
    }
    pcVar3 = "inbound";
    pcVar2 = "";
    break;
  case OUTBOUND_FULL_RELAY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_009311cd;
    pcVar3 = "outbound-full-relay";
    pcVar2 = "";
    break;
  case MANUAL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_009311cd;
    pcVar3 = "manual";
    pcVar2 = "";
    break;
  case FEELER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_009311cd;
    pcVar3 = "feeler";
    pcVar2 = "";
    break;
  case BLOCK_RELAY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_009311cd;
    pcVar3 = "block-relay-only";
    pcVar2 = "";
    break;
  case ADDR_FETCH:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_009311cd;
    pcVar3 = "addr-fetch";
    pcVar2 = "";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/connection_types.cpp"
                  ,0x19,"std::string ConnectionTypeAsString(ConnectionType)");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ConnectionTypeAsString(ConnectionType conn_type)
{
    switch (conn_type) {
    case ConnectionType::INBOUND:
        return "inbound";
    case ConnectionType::MANUAL:
        return "manual";
    case ConnectionType::FEELER:
        return "feeler";
    case ConnectionType::OUTBOUND_FULL_RELAY:
        return "outbound-full-relay";
    case ConnectionType::BLOCK_RELAY:
        return "block-relay-only";
    case ConnectionType::ADDR_FETCH:
        return "addr-fetch";
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}